

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::UTF8CoerceToStructurallyValid
          (internal *this,StringPiece src_str,char *idst,char replace_char)

{
  long lVar1;
  internal *piVar2;
  int str_length;
  size_t sVar3;
  internal *piVar4;
  int bytes_consumed;
  int local_44;
  internal *local_40;
  int local_34;
  
  piVar4 = (internal *)src_str.length_;
  local_40 = this;
  if ((anonymous_namespace)::module_initialized_ == '\x01') {
    local_34 = 0;
    str_length = (int)src_str.ptr_;
    UTF8GenericScanFastAscii
              ((UTF8ScanObj *)utf8acceptnonsurrogates_obj,(char *)this,str_length,&local_34);
    sVar3 = (size_t)local_34;
    if (local_34 != str_length) {
      memmove(piVar4,this,sVar3);
      local_40 = piVar4;
      if ((long)sVar3 < (long)str_length) {
        piVar2 = this + sVar3;
        piVar4 = piVar4 + sVar3;
        do {
          *piVar4 = SUB81(idst,0);
          piVar2 = piVar2 + 1;
          lVar1 = (long)(this + str_length) - (long)piVar2;
          if (lVar1 < 0) {
            __assert_fail("len >= 0",
                          "src/../third_party/protobuf-lite/google/protobuf/stubs/stringpiece.h",
                          0xe5,
                          "google::protobuf::StringPiece::StringPiece(const char *, stringpiece_ssize_type)"
                         );
          }
          local_44 = 0;
          UTF8GenericScanFastAscii
                    ((UTF8ScanObj *)utf8acceptnonsurrogates_obj,(char *)piVar2,(int)lVar1,&local_44)
          ;
          sVar3 = (size_t)local_44;
          memmove(piVar4 + 1,piVar2,sVar3);
          piVar2 = piVar2 + sVar3;
          piVar4 = piVar4 + sVar3 + 1;
        } while (piVar2 < this + str_length);
      }
    }
  }
  return (char *)local_40;
}

Assistant:

char* UTF8CoerceToStructurallyValid(StringPiece src_str, char* idst,
                                    const char replace_char) {
  const char* isrc = src_str.data();
  const int len = src_str.length();
  int n = UTF8SpnStructurallyValid(src_str);
  if (n == len) {               // Normal case -- all is cool, return
    return const_cast<char*>(isrc);
  } else {                      // Unusual case -- copy w/o bad bytes
    const char* src = isrc;
    const char* srclimit = isrc + len;
    char* dst = idst;
    memmove(dst, src, n);       // Copy initial good chunk
    src += n;
    dst += n;
    while (src < srclimit) {    // src points to bogus byte or is off the end
      dst[0] = replace_char;                    // replace one bad byte
      src++;
      dst++;
      StringPiece str2(src, srclimit - src);
      n = UTF8SpnStructurallyValid(str2);       // scan the remainder
      memmove(dst, src, n);                     // copy next good chunk
      src += n;
      dst += n;
    }
  }
  return idst;
}